

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

Chainstate * __thiscall
ChainstateManager::InitializeChainstate(ChainstateManager *this,CTxMemPool *mempool)

{
  bool bVar1;
  pointer pCVar2;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_RDI;
  long in_FS_OFFSET;
  ChainstateManager *in_stack_00000048;
  BlockManager *in_stack_00000050;
  CTxMemPool **in_stack_00000058;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_ffffffffffffffc8;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *this_00;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_ffffffffffffffd0;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffffd0,
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x14a9ff9);
  bVar1 = std::unique_ptr::operator_cast_to_bool(in_stack_ffffffffffffffc8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_ibd_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x15e4,"Chainstate &ChainstateManager::InitializeChainstate(CTxMemPool *)");
  }
  if (in_RDI[2]._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
    __assert_fail("!m_active_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x15e5,"Chainstate &ChainstateManager::InitializeChainstate(CTxMemPool *)");
  }
  this_00 = local_18;
  std::make_unique<Chainstate,CTxMemPool*&,node::BlockManager&,ChainstateManager&>
            (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator=
            (in_RDI,in_stack_ffffffffffffffd0);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr(in_RDI);
  pCVar2 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get(this_00);
  in_RDI[2]._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = pCVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI[2]._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate& ChainstateManager::InitializeChainstate(CTxMemPool* mempool)
{
    AssertLockHeld(::cs_main);
    assert(!m_ibd_chainstate);
    assert(!m_active_chainstate);

    m_ibd_chainstate = std::make_unique<Chainstate>(mempool, m_blockman, *this);
    m_active_chainstate = m_ibd_chainstate.get();
    return *m_active_chainstate;
}